

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testHTML.c
# Opt level: O3

xmlParserInputPtr resolveEntityDebug(void *ctx,xmlChar *publicId,xmlChar *systemId)

{
  fwrite("SAX.resolveEntity(",0x12,1,_stdout);
  if (publicId == (xmlChar *)0x0) {
    fputc(0x20,_stdout);
  }
  else {
    fputs((char *)publicId,_stdout);
  }
  if (systemId == (xmlChar *)0x0) {
    fwrite(", )\n",4,1,_stdout);
  }
  else {
    fprintf(_stdout,", %s)\n",systemId);
  }
  return (xmlParserInputPtr)0x0;
}

Assistant:

static xmlParserInputPtr
resolveEntityDebug(void *ctx ATTRIBUTE_UNUSED, const xmlChar *publicId, const xmlChar *systemId)
{
    /* xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx; */


    fprintf(stdout, "SAX.resolveEntity(");
    if (publicId != NULL)
	fprintf(stdout, "%s", (char *)publicId);
    else
	fprintf(stdout, " ");
    if (systemId != NULL)
	fprintf(stdout, ", %s)\n", (char *)systemId);
    else
	fprintf(stdout, ", )\n");
/*********
    if (systemId != NULL) {
        return(xmlNewInputFromFile(ctxt, (char *) systemId));
    }
 *********/
    return(NULL);
}